

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor.hpp
# Opt level: O0

void __thiscall
taylor<double,1,12>::shift<6,double>(taylor<double,1,12> *this,taylor<double,_1,_6> *out,double *dx)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  int local_98;
  int local_94;
  int j;
  int i_1;
  int i;
  double dxpow [13];
  double *dx_local;
  taylor<double,_1,_6> *out_local;
  taylor<double,_1,_12> *this_local;
  
  i_1 = 0;
  dxpow[0xc] = (double)dx;
  taylor<double,1,6>::operator=((taylor<double,1,6> *)out,&i_1);
  _i = 0x3ff0000000000000;
  for (j = 1; j < 0xd; j = j + 1) {
    *(double *)(&i + (long)j * 2) = *(double *)dxpow[0xc] * *(double *)(&i + (long)(j + -1) * 2);
  }
  for (local_94 = 0; local_94 < 7; local_94 = local_94 + 1) {
    for (local_98 = local_94; local_98 < 0xd; local_98 = local_98 + 1) {
      iVar3 = taylorlen(local_98 - local_94,local_94);
      dVar1 = *(double *)(&i + (long)(local_98 - local_94) * 2);
      pdVar4 = taylor<double,_1,_12>::operator[]((taylor<double,_1,_12> *)this,local_98);
      dVar2 = *pdVar4;
      pdVar4 = taylor<double,_1,_6>::operator[](out,local_94);
      *pdVar4 = (double)iVar3 * dVar1 * dVar2 + *pdVar4;
    }
  }
  return;
}

Assistant:

void shift(taylor<Tout, 1, NdegOut> & out, const Tout dx[Nvar]) const {
    assert(Nvar == 1);
    assert(NdegOut <= Ndeg);
    T dxpow[Ndeg + 1];
    out = 0;
    dxpow[0] = 1;
    for (int i = 1; i <= Ndeg; i++)
      dxpow[i] = dx[0] * dxpow[i - 1];
    for (int i = 0; i <= NdegOut; i++)
      for (int j = i; j <= Ndeg; j++)
        out[i] += taylorlen(j - i, i) * dxpow[j - i] * (*this)[j];
  }